

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encryption_state.cpp
# Opt level: O3

void __thiscall
duckdb::EncryptionState::InitializeEncryption
          (EncryptionState *this,const_data_ptr_t iv,idx_t iv_len,string *key)

{
  NotImplementedException *this_00;
  string local_40;
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"EncryptionState Abstract Class is called","");
  NotImplementedException::NotImplementedException(this_00,&local_40);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void EncryptionState::InitializeEncryption(duckdb::const_data_ptr_t iv, duckdb::idx_t iv_len, const std::string *key) {
	throw NotImplementedException("EncryptionState Abstract Class is called");
}